

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall streams_tests::xor_file::test_method(xor_file *this)

{
  pointer *num_args;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_01;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_02;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_03;
  shared_count **ppsVar1;
  int iVar2;
  undefined1 *file;
  void *pvVar3;
  AutoFile *pAVar4;
  FILE *pFVar5;
  uchar *puVar6;
  exception *e;
  undefined1 **ppuVar7;
  size_t sVar8;
  size_t __n;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  ulong uVar11;
  value_type *__val;
  long in_FS_OFFSET;
  bool bVar12;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<std::byte> __l_01;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  Span<const_unsigned_char> s;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  const_string file_10;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  Span<const_unsigned_char> s_04;
  Span<const_unsigned_char> s_05;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  undefined1 auVar13 [12];
  vector<std::byte,_std::allocator<std::byte>_> read2;
  vector<std::byte,_std::allocator<std::byte>_> read1;
  vector<std::byte,_std::allocator<std::byte>_> xor_pat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test1;
  uint8_t obj;
  uint8_t obj_1;
  AutoFile xor_file;
  uint8_t obj_2;
  path xor_path;
  undefined4 in_stack_fffffffffffff918;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffff91c;
  undefined4 uVar15;
  char *in_stack_fffffffffffff920;
  char *pcVar16;
  pointer in_stack_fffffffffffff928;
  pointer pbVar17;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  void *local_598;
  void *pvStack_590;
  long local_588;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  vector<std::byte,_std::allocator<std::byte>_> local_4b8;
  vector<std::byte,_std::allocator<std::byte>_> local_498;
  void *local_478;
  void *pvStack_470;
  long local_468;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  void *local_3b8;
  undefined8 uStack_3b0;
  long local_3a8;
  void *local_398;
  void *pvStack_390;
  long local_388;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  lazy_ostream local_268;
  FILE *local_258;
  char *local_250;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  void *local_1d8;
  void *pvStack_1d0;
  long local_1c8;
  vector<std::byte,_std::allocator<std::byte>_> local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  undefined1 local_172;
  undefined1 local_171;
  vector<std::byte,_std::allocator<std::byte>_> local_170;
  undefined1 local_158 [8];
  assertion_result local_150;
  AutoFile local_138;
  string local_108;
  string local_e8;
  path local_c8;
  path local_a0;
  assertion_result local_78;
  vector<std::byte,_std::allocator<std::byte>_> *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_c8,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_c8,0xc,"test_xor.bin");
  std::filesystem::__cxx11::path::path(&local_a0,&local_c8);
  std::filesystem::__cxx11::path::~path(&local_c8);
  local_138.m_file._0_2_ = 0x201;
  local_138.m_file._2_1_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_138;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_190,__l,(allocator_type *)local_58);
  local_138.m_file._0_2_ = 0x504;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_138;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_1a8,__l_00,(allocator_type *)local_58);
  local_138.m_file._0_2_ = 0xff;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_138;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&local_1c0,__l_01,(allocator_type *)local_58);
  file = (undefined1 *)fsbridge::fopen((char *)&local_a0,"rb");
  local_1d8 = (void *)0x0;
  pvStack_1d0 = (void *)0x0;
  local_1c8 = 0;
  uVar11 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar11 == 0) {
    pvVar3 = (void *)0x0;
    sVar8 = 0;
LAB_0064304b:
    local_1c8 = uVar11 + (long)pvVar3;
    local_1d8 = pvVar3;
    if (local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvStack_1d0 = pvVar3;
      memmove(pvVar3,local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar8);
    }
    pvStack_1d0 = (void *)((long)pvVar3 + sVar8);
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff91c;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff918;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff920;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff928;
    AutoFile::AutoFile(&local_138,(FILE *)file,data_xor);
    if (local_1d8 != (void *)0x0) {
      operator_delete(local_1d8,local_1c8 - (long)local_1d8);
    }
    local_1e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_1e0 = "";
    ppuVar7 = &local_1f8;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1b;
    file_00.m_begin = (iterator)&local_1e8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar7,msg);
    local_172 = 0;
    AutoFile::write(&local_138,(int)&local_172,(void *)0x1,(size_t)ppuVar7);
    local_208 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_200 = "";
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x1b;
    file_01.m_begin = (iterator)&local_208;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_218,
               msg_00);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_220 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff920,
               (size_t)&local_228,0x1b);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_280 = "";
    ppuVar7 = &local_298;
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x1c;
    file_02.m_begin = (iterator)&local_288;
    msg_01.m_end = pvVar10;
    msg_01.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar7,msg_01
              );
    AutoFile::read(&local_138,(int)&local_171,(void *)0x1,(size_t)ppuVar7);
    local_2a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x1c;
    file_03.m_begin = (iterator)&local_2a8;
    msg_02.m_end = pvVar10;
    msg_02.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2b8,
               msg_02);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_2c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_2c0 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff920,
               (size_t)&local_2c8,0x1c);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    local_308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_300 = "";
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x1d;
    file_04.m_begin = (iterator)&local_308;
    msg_03.m_end = pvVar10;
    msg_03.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_318,
               msg_03);
    AutoFile::ignore(&local_138,1);
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x1d;
    file_05.m_begin = (iterator)&local_328;
    msg_04.m_end = pvVar10;
    msg_04.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
               msg_04);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_348 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_340 = "";
    uVar14 = 0;
    uVar15 = 0;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    sVar8 = 0x1d;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff920,
               (size_t)&local_348,0x1d);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    AutoFile::~AutoFile(&local_138);
    file = (undefined1 *)fsbridge::fopen((char *)&local_a0,"wbx");
    local_398 = (void *)0x0;
    pvStack_390 = (void *)0x0;
    local_388 = 0;
    uVar11 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar11 == 0) {
      pvVar3 = (void *)0x0;
      __n = 0;
    }
    else {
      if ((long)uVar11 < 0) goto LAB_006444f1;
      pvVar3 = operator_new(uVar11);
      __n = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_388 = uVar11 + (long)pvVar3;
    local_398 = pvVar3;
    if (local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvStack_390 = pvVar3;
      memmove(pvVar3,local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
    }
    pvStack_390 = (void *)((long)pvVar3 + __n);
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar15;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar14;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff920;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff928;
    AutoFile::AutoFile(&local_138,(FILE *)file,data_xor_00);
    if (local_398 != (void *)0x0) {
      operator_delete(local_398,local_388 - (long)local_398);
    }
    pAVar4 = AutoFile::operator<<(&local_138,&local_190);
    AutoFile::operator<<(pAVar4,&local_1a8);
    AutoFile::~AutoFile(&local_138);
    pFVar5 = fsbridge::fopen((char *)&local_a0,"rb");
    local_3b8 = (void *)0x0;
    uStack_3b0 = 0;
    local_3a8 = 0;
    data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar15;
    data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar14;
    data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff920;
    data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff928;
    AutoFile::AutoFile(&local_138,(FILE *)pFVar5,data_xor_01);
    if (local_3b8 != (void *)0x0) {
      operator_delete(local_3b8,local_3a8 - (long)local_3b8);
    }
    puVar6 = (uchar *)operator_new(7);
    puVar6[3] = '\0';
    puVar6[4] = '\0';
    puVar6[5] = '\0';
    puVar6[6] = '\0';
    puVar6[0] = '\0';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    AutoFile::read(&local_138,(int)puVar6,(void *)0x7,sVar8);
    local_3c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_3c0 = "";
    local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x2e;
    file_06.m_begin = (iterator)&local_3c8;
    msg_05.m_end = in_R9;
    msg_05.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3d8,
               msg_05);
    local_268.m_empty = false;
    local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    file = boost::unit_test::lazy_ostream::inst;
    local_258 = (FILE *)boost::unit_test::lazy_ostream::inst;
    local_250 = "";
    s.m_size = 7;
    s.m_data = puVar6;
    HexStr_abi_cxx11_(&local_e8,s);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_e8,"fc01fd03fd04fa");
    local_108._M_dataplus._M_p._0_1_ = iVar2 == 0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_150._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_150.m_message.px = (element_type *)0xf1d3b0;
    local_48._8_8_ = &local_498;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_60 = &local_4b8;
    local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xf1d635;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_01389088;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pbVar17 = local_58;
    in_stack_fffffffffffff920 = "HexStr(raw)";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_e8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_108,&local_268,1,2,REQUIRE,0xf1d629,(size_t)&local_150,
               0x2e,pbVar17,"\"fc01fd03fd04fa\"",&local_78);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_108.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
        &local_e8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                      local_e8.field_2._M_allocated_capacity + 1);
    }
    local_3e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_3e0 = "";
    local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x30;
    file_07.m_begin = (iterator)&local_3e8;
    msg_06.m_end = pvVar10;
    msg_06.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3f8,
               msg_06);
    AutoFile::ignore(&local_138,1);
    local_408 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_400 = "";
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x30;
    file_08.m_begin = (iterator)&local_408;
    msg_07.m_end = pvVar10;
    msg_07.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_418,
               msg_07);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_428 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_420 = "";
    uVar14 = 0;
    uVar15 = 0;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff920,
               (size_t)&local_428,0x30);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    operator_delete(puVar6,7);
    AutoFile::~AutoFile(&local_138);
    pFVar5 = fsbridge::fopen((char *)&local_a0,"rb");
    local_478 = (void *)0x0;
    pvStack_470 = (void *)0x0;
    local_468 = 0;
    uVar11 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar11 == 0) {
      pvVar3 = (void *)0x0;
      sVar8 = 0;
    }
    else {
      if ((long)uVar11 < 0) goto LAB_0064450d;
      pvVar3 = operator_new(uVar11);
      sVar8 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    local_468 = uVar11 + (long)pvVar3;
    local_478 = pvVar3;
    if (local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvStack_470 = pvVar3;
      memmove(pvVar3,local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar8);
    }
    pvStack_470 = (void *)((long)pvVar3 + sVar8);
    data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar15;
    data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar14;
    data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff920;
    data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pbVar17;
    AutoFile::AutoFile(&local_138,(FILE *)pFVar5,data_xor_02);
    if (local_478 != (void *)0x0) {
      operator_delete(local_478,local_468 - (long)local_478);
    }
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pAVar4 = AutoFile::operator>>(&local_138,&local_498);
    AutoFile::operator>>(pAVar4,&local_4b8);
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_4c0 = "";
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x36;
    file_09.m_begin = (iterator)&local_4c8;
    msg_08.m_end = in_R9;
    msg_08.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4d8,
               msg_08);
    local_268.m_empty = false;
    local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_258 = (FILE *)boost::unit_test::lazy_ostream::inst;
    local_250 = "";
    s_00.m_size = (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_00.m_data = local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_e8,s_00);
    s_01.m_size = (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_01.m_data = local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_108,s_01);
    if (local_e8._M_string_length == local_108._M_string_length) {
      if (local_e8._M_string_length == 0) {
        bVar12 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,
                                      local_e8._M_dataplus._M_p._0_1_),
                     (void *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                      local_108._M_dataplus._M_p._0_1_),local_e8._M_string_length);
        bVar12 = iVar2 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar12;
    local_150.m_message.px = (element_type *)0x0;
    local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf1d34a;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xf1d3b0;
    local_48._8_8_ = local_158;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_108;
    local_158 = (undefined1  [8])&local_e8;
    local_60 = &local_170;
    boost::test_tools::tt_detail::report_assertion
              (&local_150,&local_268,1,2,REQUIRE,0xf1d70c,
               (size_t)&local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish,0x36,local_58,"HexStr(test1)",&local_78);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
        &local_e8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                      local_e8.field_2._M_allocated_capacity + 1);
    }
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_4e0 = "";
    local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x37;
    file_10.m_begin = (iterator)&local_4e8;
    msg_09.m_end = pvVar10;
    msg_09.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4f8,
               msg_09);
    local_268.m_empty = false;
    local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_258 = (FILE *)boost::unit_test::lazy_ostream::inst;
    local_250 = "";
    s_02.m_size = (long)local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_02.m_data = local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_e8,s_02);
    s_03.m_size = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_03.m_data = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_108,s_03);
    if (local_e8._M_string_length == local_108._M_string_length) {
      if (local_e8._M_string_length == 0) {
        bVar12 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,
                                      local_e8._M_dataplus._M_p._0_1_),
                     (void *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                      local_108._M_dataplus._M_p._0_1_),local_e8._M_string_length);
        bVar12 = iVar2 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar12;
    local_150.m_message.px = (element_type *)0x0;
    local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
    num_args = &local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf1d34a;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xf1d3b0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = local_158;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pbVar17 = local_58;
    in_stack_fffffffffffff920 = "HexStr(read2)";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_108;
    local_158 = (undefined1  [8])&local_e8;
    local_60 = &local_170;
    boost::test_tools::tt_detail::report_assertion
              (&local_150,&local_268,1,2,REQUIRE,0xf1d728,(size_t)num_args,0x37,pbVar17,
               "HexStr(test2)",&local_78);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
        &local_e8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                      local_e8.field_2._M_allocated_capacity + 1);
    }
    local_508 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_500 = "";
    ppuVar7 = &local_518;
    local_518 = &boost::unit_test::basic_cstring<char_const>::null;
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x39;
    file_11.m_begin = (iterator)&local_508;
    msg_10.m_end = pvVar10;
    msg_10.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)ppuVar7,msg_10
              );
    AutoFile::read(&local_138,(int)&local_170,(void *)0x1,(size_t)ppuVar7);
    local_528 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_520 = "";
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    local_530 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x39;
    file_12.m_begin = (iterator)&local_528;
    msg_11.m_end = pvVar10;
    msg_11.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_538,
               msg_11);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_548 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_540 = "";
    uVar14 = 0;
    uVar15 = 0;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)in_stack_fffffffffffff920,
               (size_t)&local_548,0x39);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    if (local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((string *)
        local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    AutoFile::~AutoFile(&local_138);
    pFVar5 = fsbridge::fopen((char *)&local_a0,"rb");
    local_598 = (void *)0x0;
    pvStack_590 = (void *)0x0;
    local_588 = 0;
    uVar11 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar11 == 0) {
      pvVar3 = (void *)0x0;
      sVar8 = 0;
    }
    else {
      if ((long)uVar11 < 0) goto LAB_00644529;
      pvVar3 = operator_new(uVar11);
      sVar8 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    local_588 = uVar11 + (long)pvVar3;
    local_598 = pvVar3;
    if (local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pvStack_590 = pvVar3;
      memmove(pvVar3,local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar8);
    }
    pvStack_590 = (void *)((long)pvVar3 + sVar8);
    data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = uVar15;
    data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar14;
    data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff920;
    data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pbVar17;
    AutoFile::AutoFile(&local_138,(FILE *)pFVar5,data_xor_03);
    if (local_598 != (void *)0x0) {
      operator_delete(local_598,local_588 - (long)local_598);
    }
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AutoFile::ignore(&local_138,4);
    AutoFile::operator>>(&local_138,&local_498);
    local_5a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5a0 = "";
    local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x41;
    file_13.m_begin = (iterator)&local_5a8;
    msg_12.m_end = in_R9;
    msg_12.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5b8,
               msg_12);
    local_268.m_empty = false;
    local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_258 = (FILE *)boost::unit_test::lazy_ostream::inst;
    local_250 = "";
    s_04.m_size = (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_04.m_data = local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_e8,s_04);
    s_05.m_size = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    s_05.m_data = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_108,s_05);
    if (local_e8._M_string_length == local_108._M_string_length) {
      if (local_e8._M_string_length == 0) {
        bVar12 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,
                                      local_e8._M_dataplus._M_p._0_1_),
                     (void *)CONCAT71(local_108._M_dataplus._M_p._1_7_,
                                      local_108._M_dataplus._M_p._0_1_),local_e8._M_string_length);
        bVar12 = iVar2 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar12;
    local_150.m_message.px = (element_type *)0x0;
    local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xf1d34a;
    local_4b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf1d3b0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_78.m_message.px = (element_type *)((ulong)local_78.m_message.px & 0xffffffffffffff00);
    local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_78.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_60 = (vector<std::byte,_std::allocator<std::byte>_> *)local_158;
    pcVar16 = "HexStr(read2)";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_e8;
    local_158 = (undefined1  [8])&local_108;
    local_48._8_8_ = num_args;
    boost::test_tools::tt_detail::report_assertion
              (&local_150,&local_268,1,2,REQUIRE,0xf1d728,(size_t)&local_4b8,0x41,local_58,
               "HexStr(test2)",&local_78);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_) !=
        &local_108.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_)
                      ,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
        &local_e8.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_),
                      local_e8.field_2._M_allocated_capacity + 1);
    }
    local_5c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5c0 = "";
    local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x43;
    file_14.m_begin = (iterator)&local_5c8;
    msg_13.m_end = pvVar10;
    msg_13.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5d8,
               msg_13);
    AutoFile::ignore(&local_138,1);
    local_5e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x43;
    file_15.m_begin = (iterator)&local_5e8;
    msg_14.m_end = pvVar10;
    msg_14.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5f8,
               msg_14);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_608 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_600 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)pcVar16,(size_t)&local_608,
               0x43);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    local_648 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_640 = "";
    ppuVar7 = &local_658;
    local_658 = &boost::unit_test::basic_cstring<char_const>::null;
    local_650 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x44;
    file_16.m_begin = (iterator)&local_648;
    msg_15.m_end = pvVar10;
    msg_15.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)ppuVar7,msg_15
              );
    AutoFile::read(&local_138,(int)&local_108,(void *)0x1,(size_t)ppuVar7);
    local_668 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_660 = "";
    local_678 = &boost::unit_test::basic_cstring<char_const>::null;
    local_670 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x44;
    file_17.m_begin = (iterator)&local_668;
    msg_16.m_end = pvVar10;
    msg_16.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_678,
               msg_16);
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_01389148;
    local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = "exception std::ios_base::failure expected but not raised";
    local_688 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_680 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)pcVar16,(size_t)&local_688,
               0x44);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  }
  else {
    if (-1 < (long)uVar11) {
      pvVar3 = operator_new(uVar11);
      sVar8 = (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      goto LAB_0064304b;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064581c;
    std::__throw_bad_alloc();
LAB_006444f1:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064581c;
    std::__throw_bad_alloc();
LAB_0064450d:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064581c;
    std::__throw_bad_alloc();
LAB_00644529:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0064581c;
    auVar13 = std::__throw_bad_alloc();
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    if (auVar13._8_4_ != 1) {
      if ((string *)
          local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (string *)0x0) {
        operator_delete(local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      AutoFile::~AutoFile(&local_138);
      if (local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_190.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::filesystem::__cxx11::path::~path(&local_a0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(auVar13._0_8_);
      }
      goto LAB_0064581c;
    }
    e = (exception *)__cxa_begin_catch(auVar13._0_8_);
    local_698 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_690 = "";
    local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_18.m_end = (iterator)0x44;
    file_18.m_begin = (iterator)&local_698;
    msg_17.m_end = in_R9;
    msg_17.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6a8,
               msg_17);
    ppsVar1 = (shared_count **)&local_78.m_message.pn;
    local_78._0_8_ = ppsVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"AutoFile::read: end of file","");
    local_58._0_8_ = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_78._0_8_,
               (long)(sp_counted_base **)local_78._0_8_ +
               (long)&((local_78.m_message.px)->m_stream).
                      super_basic_ostream<char,_std::char_traits<char>_>);
    local_e8._M_dataplus._M_p._0_1_ = HasReason::operator()((HasReason *)local_58,e);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    local_268.m_empty = false;
    local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138bae8;
    local_250 = 
    "exception \"std::ios_base::failure\" raised as expected: validation on the raised exception through predicate \"HasReason{\"AutoFile::read: end of file\"}\""
    ;
    local_6b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_6b0 = "";
    local_258 = (FILE *)file;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,&local_268,1,1,WARN,
               (check_type)in_stack_fffffffffffff920,(size_t)&local_6b8,0x44);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_e8.field_2._M_allocated_capacity);
    if ((undefined1 *)local_58._0_8_ != local_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
    }
    if ((shared_count **)local_78._0_8_ != ppsVar1) {
      operator_delete((void *)local_78._0_8_,
                      (ulong)((long)&(local_78.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
    }
    __cxa_end_catch();
  }
  if ((string *)
      local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (string *)0x0) {
    operator_delete(local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  AutoFile::~AutoFile(&local_138);
  if (local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0064581c:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(xor_file)
{
    fs::path xor_path{m_args.GetDataDirBase() / "test_xor.bin"};
    auto raw_file{[&](const auto& mode) { return fsbridge::fopen(xor_path, mode); }};
    const std::vector<uint8_t> test1{1, 2, 3};
    const std::vector<uint8_t> test2{4, 5};
    const std::vector<std::byte> xor_pat{std::byte{0xff}, std::byte{0x00}};
    {
        // Check errors for missing file
        AutoFile xor_file{raw_file("rb"), xor_pat};
        BOOST_CHECK_EXCEPTION(xor_file << std::byte{}, std::ios_base::failure, HasReason{"AutoFile::write: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: file handle is nullpt"});
    }
    {
#ifdef __MINGW64__
        // Temporary workaround for https://github.com/bitcoin/bitcoin/issues/30210
        const char* mode = "wb";
#else
        const char* mode = "wbx";
#endif
        AutoFile xor_file{raw_file(mode), xor_pat};
        xor_file << test1 << test2;
    }
    {
        // Read raw from disk
        AutoFile non_xor_file{raw_file("rb")};
        std::vector<std::byte> raw(7);
        non_xor_file >> Span{raw};
        BOOST_CHECK_EQUAL(HexStr(raw), "fc01fd03fd04fa");
        // Check that no padding exists
        BOOST_CHECK_EXCEPTION(non_xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read1, read2;
        xor_file >> read1 >> read2;
        BOOST_CHECK_EQUAL(HexStr(read1), HexStr(test1));
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that eof was reached
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read2;
        // Check that ignore works
        xor_file.ignore(4);
        xor_file >> read2;
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that ignore and read fail now
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
}